

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_zip_filename_encoding.c
# Opt level: O0

void test_zip_filename_encoding_UTF8(void)

{
  int iVar1;
  char *pcVar2;
  archive_conflict *paVar3;
  size_t local_1020;
  size_t used;
  char buff [4096];
  archive_entry *entry;
  archive *a;
  
  pcVar2 = setlocale(6,"en_US.UTF-8");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,L'%');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    paVar3 = (archive_conflict *)archive_write_new();
    iVar1 = archive_write_set_format_zip((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'.',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options((archive *)paVar3,"hdrcharset=UTF-8");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory((archive *)paVar3,&used,0x1000,&local_1020);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'6',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      buff._4088_8_ = archive_entry_new2(paVar3);
      archive_entry_set_pathname((archive_entry *)buff._4088_8_,anon_var_dwarf_1724e);
      archive_entry_set_filetype((archive_entry *)buff._4088_8_,0x8000);
      archive_entry_set_size((archive_entry *)buff._4088_8_,0);
      iVar1 = archive_write_header((archive *)paVar3,(archive_entry *)buff._4088_8_);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'=',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free((archive_entry *)buff._4088_8_);
      iVar1 = archive_write_free((archive *)paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'C',8,"0x08",(long)used._7_1_,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'D',buff + 0x16,"buff + 30",anon_var_dwarf_1724e,
                          "\"\\xD0\\xBF\\xD1\\x80\\xD0\\xB8\"",6,"6",(void *)0x0);
      paVar3 = (archive_conflict *)archive_write_new();
      iVar1 = archive_write_set_format_zip((archive *)paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'M',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                          (void *)0x0);
      iVar1 = archive_write_open_memory((archive *)paVar3,&used,0x1000,&local_1020);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'O',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      buff._4088_8_ = archive_entry_new2(paVar3);
      archive_entry_set_pathname((archive_entry *)buff._4088_8_,anon_var_dwarf_1724e);
      archive_entry_set_filetype((archive_entry *)buff._4088_8_,0x8000);
      archive_entry_set_size((archive_entry *)buff._4088_8_,0);
      iVar1 = archive_write_header((archive *)paVar3,(archive_entry *)buff._4088_8_);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'V',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free((archive_entry *)buff._4088_8_);
      iVar1 = archive_write_free((archive *)paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'X',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'\\',8,"0x08",(long)used._7_1_,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L']',buff + 0x16,"buff + 30",anon_var_dwarf_1724e,
                          "\"\\xD0\\xBF\\xD1\\x80\\xD0\\xB8\"",6,"6",(void *)0x0);
      paVar3 = (archive_conflict *)archive_write_new();
      iVar1 = archive_write_set_format_zip((archive *)paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                          (void *)0x0);
      iVar1 = archive_write_open_memory((archive *)paVar3,&used,0x1000,&local_1020);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'g',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      buff._4088_8_ = archive_entry_new2(paVar3);
      archive_entry_set_pathname((archive_entry *)buff._4088_8_,"abcABC");
      archive_entry_set_filetype((archive_entry *)buff._4088_8_,0x8000);
      archive_entry_set_size((archive_entry *)buff._4088_8_,0);
      iVar1 = archive_write_header((archive *)paVar3,(archive_entry *)buff._4088_8_);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'n',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free((archive_entry *)buff._4088_8_);
      iVar1 = archive_write_free((archive *)paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L't',0,"0",(long)used._7_1_,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'u',buff + 0x16,"buff + 30","abcABC","\"abcABC\"",6,"6",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                     ,L'0');
      test_skipping("This system cannot convert character-set for UTF-8.");
      archive_write_free((archive *)paVar3);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_zip_filename_encoding_UTF8)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
		skipping("en_US.UTF-8 locale not available on this system.");
		return;
	}

	/*
	 * Verify that UTF-8 filenames are correctly stored with
	 * hdrcharset=UTF-8 option.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
	if (archive_write_set_options(a, "hdrcharset=UTF-8") != ARCHIVE_OK) {
		skipping("This system cannot convert character-set"
		    " for UTF-8.");
		archive_write_free(a);
		return;
	}
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a UTF-8 filename. */
	archive_entry_set_pathname(entry, "\xD0\xBF\xD1\x80\xD0\xB8");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* A bit 11 of general purpose flag should be 0x08,
	 * which indicates the filename charset is UTF-8. */
	assertEqualInt(0x08, buff[7]);
	assertEqualMem(buff + 30, "\xD0\xBF\xD1\x80\xD0\xB8", 6);

	/*
	 * Verify that UTF-8 filenames are correctly stored without
	 * hdrcharset=UTF-8 option.
	 * Skip on Windows where we default to OEMCP
	 */
#if !defined(_WIN32) || defined(__CYGWIN__)
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a UTF-8 filename. */
	archive_entry_set_pathname(entry, "\xD0\xBF\xD1\x80\xD0\xB8");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* A bit 11 of general purpose flag should be 0x08,
	 * which indicates the filename charset is UTF-8. */
	assertEqualInt(0x08, buff[7]);
	assertEqualMem(buff + 30, "\xD0\xBF\xD1\x80\xD0\xB8", 6);
#endif

	/*
	 * Verify that A bit 11 of general purpose flag is not set
	 * when ASCII filenames are stored.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set an ASCII filename. */
	archive_entry_set_pathname(entry, "abcABC");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* A bit 11 of general purpose flag should be 0,
	 * which indicates the filename charset is unknown. */
	assertEqualInt(0, buff[7]);
	assertEqualMem(buff + 30, "abcABC", 6);
}